

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

DescriptorProto *
google::protobuf::descriptor_unittest::AddMessage(FileDescriptorProto *file,string *name)

{
  DescriptorProto *pDVar1;
  Arena *arena;
  
  pDVar1 = (DescriptorProto *)
           protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (&(file->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,
                      Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
  *(byte *)&pDVar1->field_0 = *(byte *)&pDVar1->field_0 | 1;
  arena = (Arena *)(pDVar1->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set<>(&(pDVar1->field_0)._impl_.name_,name,arena);
  return pDVar1;
}

Assistant:

DescriptorProto* AddMessage(FileDescriptorProto* file,
                            const std::string& name) {
  DescriptorProto* result = file->add_message_type();
  result->set_name(name);
  return result;
}